

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<1,_11,_11>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  bool bVar6;
  undefined8 in_RAX;
  bool bVar7;
  long lVar8;
  undefined8 *puVar9;
  float *pfVar10;
  int col_2;
  int col;
  long lVar11;
  int col_1;
  undefined4 uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float afStack_88 [2];
  Matrix<float,_2,_4> res;
  undefined1 local_58 [8];
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined1 local_38 [8];
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  int aiStack_18 [5];
  undefined4 uStack_4;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar8 = 0;
    puVar9 = (undefined8 *)local_38;
    bVar6 = true;
    do {
      bVar7 = bVar6;
      lVar11 = 0;
      do {
        uVar12 = 0x3f800000;
        if (lVar8 != lVar11) {
          uVar12 = 0;
        }
        *(undefined4 *)(puVar9 + lVar11) = uVar12;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 4);
      lVar8 = 1;
      puVar9 = (undefined8 *)((long)local_38 + 4);
      bVar6 = false;
    } while (bVar7);
    local_38 = (undefined1  [8])*(undefined8 *)evalCtx->in[0].m_data;
    uStack_30 = *(undefined8 *)evalCtx->in[1].m_data;
    local_28 = *(undefined8 *)evalCtx->in[2].m_data;
    uStack_20 = *(undefined8 *)evalCtx->in[3].m_data;
  }
  else {
    local_28 = 0;
    uStack_20 = 0;
    local_38 = (undefined1  [8])0x0;
    uStack_30 = 0;
    lVar8 = 0;
    puVar9 = (undefined8 *)local_38;
    bVar6 = true;
    do {
      bVar7 = bVar6;
      lVar11 = 0;
      do {
        *(undefined4 *)(puVar9 + lVar11) =
             *(undefined4 *)((long)&sr::(anonymous_namespace)::s_constInMat4x2 + lVar8 + lVar11 * 4)
        ;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 4);
      lVar8 = 0x10;
      puVar9 = (undefined8 *)((long)local_38 + 4);
      bVar6 = false;
    } while (bVar7);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    lVar8 = 0;
    puVar9 = (undefined8 *)local_58;
    bVar6 = true;
    do {
      bVar7 = bVar6;
      lVar11 = 0;
      do {
        uVar12 = 0x3f800000;
        if (lVar8 != lVar11) {
          uVar12 = 0;
        }
        *(undefined4 *)(puVar9 + lVar11) = uVar12;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 4);
      lVar8 = 1;
      puVar9 = (undefined8 *)((long)local_58 + 4);
      bVar6 = false;
    } while (bVar7);
    local_58 = (undefined1  [8])*(undefined8 *)evalCtx->in[0].m_data;
    uStack_50 = *(undefined8 *)evalCtx->in[1].m_data;
    local_48 = *(undefined8 *)evalCtx->in[2].m_data;
    uStack_40 = *(undefined8 *)evalCtx->in[3].m_data;
  }
  else {
    local_48 = 0;
    uStack_40 = 0;
    local_58 = (undefined1  [8])0x0;
    uStack_50 = 0;
    lVar8 = 0;
    puVar9 = (undefined8 *)local_58;
    bVar6 = true;
    do {
      bVar7 = bVar6;
      lVar11 = 0;
      do {
        *(undefined4 *)(puVar9 + lVar11) = *(undefined4 *)((long)&DAT_00b1fa20 + lVar11 * 4 + lVar8)
        ;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 4);
      lVar8 = 0x10;
      puVar9 = (undefined8 *)((long)local_58 + 4);
      bVar6 = false;
    } while (bVar7);
  }
  res.m_data.m_data[2].m_data[0] = 0.0;
  res.m_data.m_data[2].m_data[1] = 0.0;
  afStack_88[0] = 0.0;
  afStack_88[1] = 0.0;
  res.m_data.m_data[0].m_data[0] = 0.0;
  res.m_data.m_data[0].m_data[1] = 0.0;
  lVar8 = 0;
  pfVar10 = afStack_88;
  bVar6 = true;
  do {
    bVar7 = bVar6;
    lVar11 = 0;
    do {
      fVar13 = 1.0;
      if (lVar8 != lVar11) {
        fVar13 = 0.0;
      }
      pfVar10[lVar11 * 2] = fVar13;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4);
    lVar8 = 1;
    pfVar10 = afStack_88 + 1;
    bVar6 = false;
  } while (bVar7);
  lVar8 = 0;
  do {
    fVar13 = *(float *)((long)local_38 + lVar8 * 8 + 4);
    fVar1 = *(float *)(&uStack_30 + lVar8);
    fVar2 = *(float *)((long)&uStack_30 + lVar8 * 8 + 4);
    fVar3 = *(float *)((long)local_58 + lVar8 * 8 + 4);
    fVar4 = *(float *)(&uStack_50 + lVar8);
    fVar5 = *(float *)((long)&uStack_50 + lVar8 * 8 + 4);
    afStack_88[lVar8 * 2] =
         *(float *)((long)local_38 + lVar8 * 8) - *(float *)((long)local_58 + lVar8 * 8);
    res.m_data.m_data[lVar8 + -1].m_data[1] = fVar13 - fVar3;
    res.m_data.m_data[lVar8].m_data[0] = fVar1 - fVar4;
    res.m_data.m_data[lVar8].m_data[1] = fVar2 - fVar5;
    lVar8 = lVar8 + 2;
  } while (lVar8 != 4);
  fVar14 = res.m_data.m_data[2].m_data[0] + afStack_88[0] + afStack_88[1];
  fVar15 = res.m_data.m_data[2].m_data[1] +
           res.m_data.m_data[0].m_data[1] + res.m_data.m_data[0].m_data[0];
  res.m_data.m_data[3].m_data[0] = fVar14;
  res.m_data.m_data[3].m_data[1] = fVar15;
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  stack0xfffffffffffffff8 = CONCAT44((int)((ulong)in_RAX >> 0x20),2);
  lVar8 = 2;
  do {
    (evalCtx->color).m_data[aiStack_18[lVar8]] = res.m_data.m_data[2].m_data[lVar8];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 - in1);
	}